

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
VectorInstance::op_replaceFirst_fromIndex_with
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  string *value;
  size_type *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  pointer psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_01;
  shared_ptr<Instance> instance;
  shared_ptr<Instance> temporary;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [5];
  uint local_40;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x60) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  value = &this->_element_type;
  get_shared_instance((string *)local_b8,value);
  get_shared_instance((string *)(local_b8 + 0x10),value);
  IntegerInstance::IntegerInstance
            ((IntegerInstance *)local_98,
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  this_01 = local_98;
  uVar7 = (ulong)local_40;
  CharacterInstance::~CharacterInstance((CharacterInstance *)this_01);
  if (((int)local_40 < 0) ||
     ((int)((ulong)((long)(this->_value).
                          super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->_value).
                         super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < (int)local_40)) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar5,&char_const*::typeinfo,0);
  }
  psVar9 = (this->_value).
           super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)local_40 <
      (int)((ulong)((long)(this->_value).
                          super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9) >> 4)) {
    lVar8 = uVar7 << 4;
    do {
      bVar4 = InstanceIsEqualToComparator::operator()
                        ((InstanceIsEqualToComparator *)this_01->_M_local_buf,
                         (shared_ptr<Instance> *)
                         ((long)&(psVar9->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr + lVar8),(shared_ptr<Instance> *)local_b8);
      if (bVar4) {
        get_shared_instance((string *)local_98,value);
        uVar3 = local_98[0]._8_8_;
        uVar2 = local_98[0]._M_allocated_capacity;
        psVar9 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_98[0]._M_allocated_capacity = 0;
        local_98[0]._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar9->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi + lVar8);
        psVar1 = (size_type *)
                 ((long)&(psVar9->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                 lVar8);
        *psVar1 = uVar2;
        psVar1[1] = uVar3;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98[0]._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98[0]._8_8_);
        }
        break;
      }
      psVar9 = (this->_value).
               super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while ((int)uVar6 <
             (int)((ulong)((long)(this->_value).
                                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9) >> 4));
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VectorInstance::op_replaceFirst_fromIndex_with(const std::vector<std::string>& arguments) {
    if (arguments.size() != 3)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    std::shared_ptr<Instance> temporary = get_shared_instance(_element_type, arguments[2]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (int i = from_index; i < int(_value.size()); i++)
        if (InstanceIsEqualToComparator()(_value[i], instance)) {
            _value[i] = get_shared_instance(_element_type, arguments[2]);
            break;
        }
    return "null";
}